

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_simpleFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_astFunctionApplicationNode_t **applicationNode;
  ulong uVar1;
  sysbvm_astFunctionApplicationNode_t *psVar2;
  long lVar3;
  undefined8 uVar4;
  ulong uVar5;
  uint uVar6;
  char *message;
  ulong uVar7;
  ulong uVar8;
  sysbvm_tuple_t sVar9;
  ulong local_b0;
  anon_struct_48_6_34a7a802 gcFrame;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  anon_struct_48_6_34a7a802 *local_40;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  local_40 = &gcFrame;
  gcFrame.variadicArguments = 0;
  gcFrame.variadicArgumentsNode = 0;
  gcFrame.analyzedArguments = 0;
  gcFrame.expectedArgumentType = 0;
  gcFrame.argumentNode = 0;
  gcFrame.analyzedArgument = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 6;
  sysbvm_stackFrame_pushRecord(&local_58);
  uVar7 = *(ulong *)(*arguments + 0xf8);
  if (uVar7 == 0 || (uVar7 & 0xf) != 0) {
    uVar7 = (long)uVar7 >> 4;
  }
  else {
    uVar7 = *(ulong *)(uVar7 + 0x10);
  }
  applicationNode = (sysbvm_astFunctionApplicationNode_t **)(arguments + 1);
  uVar6 = (uint)uVar7 & 0x600;
  uVar8 = *(ulong *)(*arguments + 0x100);
  if ((uVar8 & 0xf) == 0 && uVar8 != 0) {
    sVar9 = (sysbvm_tuple_t)(*(uint *)(uVar8 + 0xc) >> 3);
  }
  else {
    sVar9 = 0;
  }
  uVar8 = (*applicationNode)->arguments;
  if ((uVar8 & 0xf) == 0 && uVar8 != 0) {
    local_b0 = (ulong)(*(uint *)(uVar8 + 0xc) >> 3);
  }
  else {
    local_b0 = 0;
  }
  if (((uVar7 & 2) != 0) && (sVar9 == 0)) {
    sysbvm_error("Variadic applications require at least a single argument.");
  }
  uVar8 = sVar9 - (((uint)uVar7 & 2) >> 1);
  if (uVar6 == 0x600) {
    if (sVar9 == 0) {
      sysbvm_error("Memoized template requires at least a single argument.");
    }
    sVar9 = sVar9 - 1;
    uVar8 = uVar8 - 1;
  }
  if (((uVar7 & 2) == 0) || (uVar8 <= local_b0)) {
    if (((uVar7 & 2) != 0) || (local_b0 == sVar9)) goto LAB_0011d915;
    message = "Expected number of arguments is mismatching.";
  }
  else {
    message = "Missing required arguments.";
  }
  sysbvm_error(message);
LAB_0011d915:
  gcFrame.analyzedArguments = sysbvm_array_create(context,sVar9);
  for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
    uVar1 = *(ulong *)(*arguments + 0x100);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      gcFrame.expectedArgumentType =
           *(sysbvm_tuple_t *)(uVar1 + (ulong)(uVar6 == 0x600) * 8 + 0x10 + uVar5 * 8);
    }
    else {
      gcFrame.expectedArgumentType = 0;
    }
    uVar1 = (*applicationNode)->arguments;
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      gcFrame.argumentNode = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar5 * 8);
    }
    else {
      gcFrame.argumentNode = 0;
    }
    gcFrame.analyzedArgument =
         sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                   (context,gcFrame.argumentNode,gcFrame.expectedArgumentType,arguments[2]);
    if ((gcFrame.analyzedArguments & 0xf) == 0 && gcFrame.analyzedArguments != 0) {
      *(sysbvm_tuple_t *)(gcFrame.analyzedArguments + 0x10 + uVar5 * 8) = gcFrame.analyzedArgument;
    }
  }
  if ((uVar7 & 2) != 0) {
    gcFrame.variadicArguments = sysbvm_array_create(context,local_b0 - uVar8);
    lVar3 = 2;
    for (uVar7 = uVar8; uVar7 < local_b0; uVar7 = uVar7 + 1) {
      uVar5 = (*applicationNode)->arguments;
      if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
        uVar4 = *(undefined8 *)(uVar5 + 0x10 + uVar7 * 8);
      }
      else {
        uVar4 = 0;
      }
      if ((gcFrame.variadicArguments & 0xf) == 0 && gcFrame.variadicArguments != 0) {
        *(undefined8 *)(gcFrame.variadicArguments + lVar3 * 8) = uVar4;
      }
      lVar3 = lVar3 + 1;
    }
    gcFrame.variadicArgumentsNode =
         sysbvm_astMakeArrayNode_create
                   (context,*(sysbvm_tuple_t *)(arguments[1] + 0x10),gcFrame.variadicArguments);
    gcFrame.variadicArgumentsNode =
         sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                   (context,gcFrame.variadicArgumentsNode,(context->roots).arrayType,arguments[2]);
    if ((gcFrame.analyzedArguments & 0xf) == 0 && gcFrame.analyzedArguments != 0) {
      *(sysbvm_tuple_t *)(gcFrame.analyzedArguments + 0x10 + uVar8 * 8) =
           gcFrame.variadicArgumentsNode;
    }
  }
  psVar2 = *applicationNode;
  uVar7 = psVar2->applicationFlags;
  if (uVar7 == 0 || (uVar7 & 0xf) != 0) {
    uVar7 = (long)uVar7 >> 4;
  }
  else {
    uVar7 = *(ulong *)(uVar7 + 0x10);
  }
  psVar2->applicationFlags = (uVar6 != 0x600 | uVar7) << 4 | 0x2b;
  psVar2->arguments = gcFrame.analyzedArguments;
  (psVar2->super).analyzedType = *(sysbvm_tuple_t *)(*arguments + 0x108);
  sysbvm_stackFrame_popRecord(&local_58);
  sVar9 = sysbvm_astFunctionApplicationNode_optimizePureApplication(context,applicationNode);
  return sVar9;
}

Assistant:

static sysbvm_tuple_t sysbvm_simpleFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_simpleFunctionType_t **simpleFunctionType = (sysbvm_simpleFunctionType_t**)&arguments[0];
    sysbvm_astFunctionApplicationNode_t **functionApplicationNode = (sysbvm_astFunctionApplicationNode_t**)&arguments[1];
    sysbvm_tuple_t *environment = &arguments[2];

    struct {
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t analyzedArgument;
        sysbvm_tuple_t analyzedArguments;
        sysbvm_tuple_t expectedArgumentType;
        sysbvm_tuple_t variadicArguments;
        sysbvm_tuple_t variadicArgumentsNode;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    sysbvm_bitflags_t flags = sysbvm_tuple_bitflags_decode((*simpleFunctionType)->super.functionFlags);
    bool isVariadic = (flags & SYSBVM_FUNCTION_FLAGS_VARIADIC) != 0;
    bool isMemoizedTemplate = (flags & SYSBVM_FUNCTION_FLAGS_MEMOIZED_TEMPLATE) == SYSBVM_FUNCTION_FLAGS_MEMOIZED_TEMPLATE;

    size_t typeArgumentCount = sysbvm_array_getSize((*simpleFunctionType)->argumentTypes);
    size_t expectedArgumentCount = typeArgumentCount;
    size_t applicationArgumentCount = sysbvm_array_getSize((*functionApplicationNode)->arguments);
    size_t startingArgumentIndex = isMemoizedTemplate ? 1 : 0;
    if(isVariadic && typeArgumentCount == 0)
        sysbvm_error("Variadic applications require at least a single argument.");

    size_t directApplicationArgumentCount = isVariadic ? typeArgumentCount - 1 : typeArgumentCount;
    if(isMemoizedTemplate)
    {
        if(expectedArgumentCount == 0)
            sysbvm_error("Memoized template requires at least a single argument.");
        --expectedArgumentCount;
        --directApplicationArgumentCount;
    }

    if(isVariadic && applicationArgumentCount < directApplicationArgumentCount)
        sysbvm_error("Missing required arguments.");
    else if(!isVariadic && applicationArgumentCount != expectedArgumentCount)
        sysbvm_error("Expected number of arguments is mismatching.");

    gcFrame.analyzedArguments = sysbvm_array_create(context, expectedArgumentCount);
    for(size_t i = 0; i < directApplicationArgumentCount; ++i)
    {
        gcFrame.expectedArgumentType = sysbvm_array_at((*simpleFunctionType)->argumentTypes, startingArgumentIndex + i);
        gcFrame.argumentNode = sysbvm_array_at((*functionApplicationNode)->arguments, i);
        gcFrame.analyzedArgument = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.argumentNode, gcFrame.expectedArgumentType, *environment);
        sysbvm_array_atPut(gcFrame.analyzedArguments, i, gcFrame.analyzedArgument);
    }

    // Analyze the variadic arguments.
    if(isVariadic)
    {
        gcFrame.variadicArguments = sysbvm_array_create(context, applicationArgumentCount - directApplicationArgumentCount);
        for(size_t i = directApplicationArgumentCount; i < applicationArgumentCount; ++i)
            sysbvm_array_atPut(gcFrame.variadicArguments, i - directApplicationArgumentCount, sysbvm_array_at((*functionApplicationNode)->arguments, i));

        gcFrame.variadicArgumentsNode = sysbvm_astMakeArrayNode_create(context, (*functionApplicationNode)->super.sourcePosition, gcFrame.variadicArguments);
        gcFrame.variadicArgumentsNode = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.variadicArgumentsNode, context->roots.arrayType, *environment);
        sysbvm_array_atPut(gcFrame.analyzedArguments, directApplicationArgumentCount, gcFrame.variadicArgumentsNode);
    }

    (*functionApplicationNode)->applicationFlags = sysbvm_tuple_bitflags_encode(sysbvm_tuple_bitflags_decode((*functionApplicationNode)->applicationFlags)
        | (isMemoizedTemplate ? 0 : SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK)
        | SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED);
    (*functionApplicationNode)->arguments = gcFrame.analyzedArguments;
    (*functionApplicationNode)->super.analyzedType = (*simpleFunctionType)->resultType;

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_astFunctionApplicationNode_optimizePureApplication(context, functionApplicationNode);
}